

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::TestMoreStuffImpl>::disposeImpl
          (HeapDisposer<capnp::_::TestMoreStuffImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)((long)pointer + 0x20));
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }